

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O2

string * __thiscall
cmCryptoHash::HashFile(string *__return_storage_ptr__,cmCryptoHash *this,string *file)

{
  uint uVar1;
  allocator local_1231;
  ifstream fin;
  int local_1228;
  uint auStack_1210 [122];
  cm_sha2_uint64_t buffer [512];
  
  std::ifstream::ifstream(&fin,(file->_M_dataplus)._M_p,_S_in|_S_bin);
  if ((*(byte *)((long)auStack_1210 + *(long *)(_fin + -0x18)) & 5) == 0) {
    (*this->_vptr_cmCryptoHash[2])(this);
    while (uVar1 = *(uint *)((long)auStack_1210 + *(long *)(_fin + -0x18)), (uVar1 & 5) == 0) {
      std::istream::read((char *)&fin,(long)buffer);
      if (local_1228 != 0) {
        (*this->_vptr_cmCryptoHash[3])(this,buffer);
      }
    }
    if ((uVar1 & 2) == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1231);
    }
    else {
      (*this->_vptr_cmCryptoHash[4])(__return_storage_ptr__,this);
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)buffer);
  }
  std::ifstream::~ifstream(&fin);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCryptoHash::HashFile(const std::string& file)
{
  cmsys::ifstream fin(file.c_str(), std::ios::in | cmsys_ios_binary);
  if(!fin)
    {
    return "";
    }

  this->Initialize();

  // Should be efficient enough on most system:
  cm_sha2_uint64_t buffer[512];
  char* buffer_c = reinterpret_cast<char*>(buffer);
  unsigned char const* buffer_uc =
    reinterpret_cast<unsigned char const*>(buffer);
  // This copy loop is very sensitive on certain platforms with
  // slightly broken stream libraries (like HPUX).  Normally, it is
  // incorrect to not check the error condition on the fin.read()
  // before using the data, but the fin.gcount() will be zero if an
  // error occurred.  Therefore, the loop should be safe everywhere.
  while(fin)
    {
    fin.read(buffer_c, sizeof(buffer));
    if(int gcount = static_cast<int>(fin.gcount()))
      {
      this->Append(buffer_uc, gcount);
      }
    }
  if(fin.eof())
    {
    return this->Finalize();
    }
  return "";
}